

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

void __thiscall
TasGrid::GridLocalPolynomial::applyTransformationTransposed<1,(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,double *weights,MultiIndexSet *work,
          vector<int,_std::allocator<int>_> *active_points)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  pointer piVar4;
  void *pvVar5;
  Data2D<int> *pDVar6;
  _Bit_type *p_Var7;
  pointer piVar8;
  int *piVar9;
  pointer piVar10;
  int iVar11;
  long lVar12;
  Data2D<int> *pDVar13;
  pointer piVar14;
  int *piVar15;
  long lVar16;
  _Bit_type *p_Var17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  uint uVar29;
  double dVar30;
  vector<double,_std::allocator<double>_> node;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> level;
  Data2D<int> lparents;
  allocator_type local_131;
  int local_130;
  int local_12c;
  ulong local_128;
  MultiIndexSet *local_120;
  ulong local_118;
  vector<int,_std::allocator<int>_> *local_110;
  ulong local_108;
  vector<double,_std::allocator<double>_> local_100;
  vector<bool,_std::allocator<bool>_> local_e8;
  vector<int,_std::allocator<int>_> local_c0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_90;
  Data2D<int> local_78;
  double *local_50;
  ulong local_48;
  ulong local_40;
  double local_38;
  
  local_130 = (int)(this->parents).num_strips;
  local_120 = work;
  local_50 = weights;
  if (work->cache_num_indexes == local_130) {
    local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_78.stride = 0;
    local_78.num_strips = 0;
    local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_12c = local_130;
  }
  else {
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)2>(&local_78,work);
    local_12c = (int)(this->parents).num_strips;
    local_130 = work->cache_num_indexes;
  }
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_90,
             (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_e8);
  piVar10 = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar12 = (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar10;
  if (lVar12 == 0) {
    local_128 = 0;
  }
  else {
    lVar12 = lVar12 >> 2;
    sVar3 = local_120->num_dimensions;
    piVar4 = (local_120->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_128 = 0;
    lVar22 = 0;
    do {
      lVar28 = (long)piVar10[lVar22] * sVar3;
      uVar18 = piVar4[lVar28];
      uVar24 = uVar18;
      if ((1 < uVar18) && (uVar24 = 1, uVar18 != 2)) {
        uVar18 = uVar18 - 1;
        do {
          uVar18 = (int)uVar18 >> 1;
          uVar24 = uVar24 + 1;
        } while (1 < uVar18);
      }
      lVar26 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
      if (1 < lVar26) {
        lVar16 = 1;
        do {
          uVar18 = piVar4[lVar28 + lVar16];
          uVar29 = uVar18;
          if ((1 < uVar18) && (uVar29 = 1, uVar18 != 2)) {
            uVar18 = uVar18 - 1;
            do {
              uVar18 = (int)uVar18 >> 1;
              uVar29 = uVar29 + 1;
            } while (1 < uVar18);
          }
          uVar24 = uVar24 + uVar29;
          lVar16 = lVar16 + 1;
        } while (lVar16 != lVar26);
      }
      if ((int)local_128 <= (int)uVar24) {
        local_128 = (ulong)uVar24;
      }
      local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar22] = uVar24;
      lVar22 = lVar22 + 1;
    } while (lVar22 != lVar12 + (ulong)(lVar12 == 0));
  }
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_a8,(long)this->top_level + 1,(allocator_type *)&local_e8);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_c0,(long)this->top_level + 1,(allocator_type *)&local_e8);
  local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            (&local_e8,(long)local_120->cache_num_indexes,(bool *)&local_100,&local_131);
  iVar25 = (this->super_BaseCanonicalGrid).num_dimensions;
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_100,(long)iVar25,(allocator_type *)&local_131);
  if (0 < (int)local_128) {
    local_108 = (ulong)(uint)(iVar25 * 2);
    piVar8 = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    piVar10 = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_110 = active_points;
    do {
      piVar14 = piVar10;
      if (piVar8 != piVar10) {
        uVar21 = 0;
        do {
          if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar21] == (int)local_128) {
            local_118 = uVar21;
            if (0 < (this->super_BaseCanonicalGrid).num_dimensions) {
              iVar25 = piVar14[uVar21];
              sVar3 = local_120->num_dimensions;
              piVar4 = (local_120->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar12 = 0;
              do {
                dVar30 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)2>
                                   (piVar4[(long)iVar25 * sVar3 + lVar12]);
                *(double *)
                 (CONCAT71(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,
                           local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start._0_1_) + lVar12 * 8) = dVar30;
                lVar12 = lVar12 + 1;
              } while (lVar12 < (this->super_BaseCanonicalGrid).num_dimensions);
            }
            uVar18 = local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
            p_Var7 = local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
            p_Var17 = local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            if (local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p !=
                local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._M_p) {
              memset(local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                     (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              p_Var17 = p_Var7;
            }
            if (uVar18 != 0) {
              *p_Var17 = *p_Var17 & ~(0xffffffffffffffffU >> (-(char)uVar18 & 0x3fU));
            }
            *local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = 0;
            piVar14 = (local_110->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            *local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = piVar14[local_118];
            active_points = local_110;
            uVar21 = local_118;
            if (*local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start < (int)local_108) {
              iVar20 = 0;
              piVar9 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              piVar15 = local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar21 = local_108;
              iVar25 = local_12c;
              iVar27 = local_130;
              do {
                iVar1 = piVar9[iVar20];
                if (iVar1 < (int)uVar21) {
                  pDVar13 = &this->parents;
                  if (iVar27 != iVar25) {
                    pDVar13 = &local_78;
                  }
                  pDVar6 = &this->parents;
                  if (iVar27 != iVar25) {
                    pDVar6 = &local_78;
                  }
                  iVar2 = *(int *)((long)piVar15[iVar20] * pDVar13->stride * 4 +
                                   (long)(pDVar6->vec).super__Vector_base<int,_std::allocator<int>_>
                                         ._M_impl.super__Vector_impl_data._M_start + (long)iVar1 * 4
                                  );
                  uVar19 = (ulong)iVar2;
                  if (uVar19 != 0xffffffffffffffff) {
                    iVar11 = iVar2 + 0x3f;
                    if (-1 < iVar2) {
                      iVar11 = iVar2;
                    }
                    uVar23 = (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001);
                    if ((local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [(long)(iVar11 >> 6) + (uVar23 - 1)] >> (uVar19 & 0x3f) & 1) == 0) {
                      lVar12 = uVar19 * local_120->num_dimensions;
                      piVar4 = (local_120->indexes).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                      local_48 = 1L << ((byte)iVar2 & 0x3f);
                      local_40 = uVar23;
                      dVar30 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)2>
                                         (this->order,piVar4[lVar12],
                                          *(double *)
                                           CONCAT71(local_100.
                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  local_100.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_));
                      uVar18 = (this->super_BaseCanonicalGrid).num_dimensions;
                      if (1 < (int)uVar18) {
                        lVar22 = 1;
                        do {
                          local_38 = dVar30;
                          dVar30 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)2>
                                             (this->order,piVar4[lVar12 + lVar22],
                                              *(double *)
                                               (CONCAT71(local_100.
                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  local_100.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                               lVar22 * 8));
                          dVar30 = local_38 * dVar30;
                          lVar22 = lVar22 + 1;
                          uVar18 = (this->super_BaseCanonicalGrid).num_dimensions;
                        } while (lVar22 < (int)uVar18);
                      }
                      if (0 < (int)uVar18) {
                        iVar25 = (local_110->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start[local_118];
                        uVar21 = 0;
                        do {
                          local_50[(long)(int)(uVar18 * iVar2) + uVar21] =
                               local_50[(long)(int)(uVar18 * iVar2) + uVar21] -
                               local_50[(long)(int)uVar18 * (long)iVar25 + uVar21] * dVar30;
                          uVar21 = uVar21 + 1;
                        } while (uVar18 != uVar21);
                      }
                      local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                      [(long)(iVar11 >> 6) + (local_40 - 1)] =
                           local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [(long)(iVar11 >> 6) + (local_40 - 1)] | local_48;
                      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)iVar20 + 1] = 0;
                      local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)iVar20 + 1] = iVar2;
                      piVar9 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      piVar15 = local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      uVar21 = local_108;
                      iVar25 = local_12c;
                      iVar27 = local_130;
                      iVar20 = iVar20 + 1;
                      goto LAB_0019c969;
                    }
                  }
                  piVar9[iVar20] = iVar1 + 1;
                }
                else {
                  piVar9[(long)iVar20 + -1] = piVar9[(long)iVar20 + -1] + 1;
                  iVar20 = iVar20 + -1;
                }
LAB_0019c969:
              } while (*piVar9 < (int)uVar21);
              piVar14 = (local_110->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              active_points = local_110;
              uVar21 = local_118;
            }
          }
          uVar21 = uVar21 + 1;
          piVar10 = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        } while (uVar21 < (ulong)((long)piVar10 - (long)piVar14 >> 2));
      }
      iVar25 = (int)local_128;
      local_128 = (ulong)(iVar25 - 1);
      piVar8 = piVar10;
      piVar10 = piVar14;
    } while (1 < iVar25);
  }
  pvVar5 = (void *)CONCAT71(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)local_100.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
  }
  if (local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
  }
  if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridLocalPolynomial::applyTransformationTransposed(double weights[], const MultiIndexSet &work, const std::vector<int> &active_points) const {
    Data2D<int> lparents = (parents.getNumStrips() != work.getNumIndexes()) ? // if the current dag loaded in parents does not reflect the indexes in work
                            HierarchyManipulations::computeDAGup<effrule>(work) :
                            Data2D<int>();

    const Data2D<int> &dagUp = (parents.getNumStrips() != work.getNumIndexes()) ? lparents : parents;

    std::vector<int> level(active_points.size());
    int active_top_level = 0;
    for(size_t i=0; i<active_points.size(); i++){
        const int *p = work.getIndex(active_points[i]);
        int current_level = RuleLocal::getLevel<effrule>(p[0]);
        for(int j=1; j<num_dimensions; j++){
            current_level += RuleLocal::getLevel<effrule>(p[j]);
        }
        if (active_top_level < current_level) active_top_level = current_level;
        level[i] = current_level;
    }

    std::vector<int> monkey_count(top_level+1);
    std::vector<int> monkey_tail(top_level+1);
    std::vector<bool> used(work.getNumIndexes());
    int max_parents = RuleLocal::getMaxNumParents<effrule>() * num_dimensions;

    std::vector<double> node(num_dimensions);

    for(int l=active_top_level; l>0; l--){
        for(size_t i=0; i<active_points.size(); i++){
            if (level[i] == l){
                int const *pnt = work.getIndex(active_points[i]);
                for(int j=0; j<num_dimensions; j++)
                    node[j] = RuleLocal::getNode<effrule>(pnt[j]);

                std::fill(used.begin(), used.end(), false);

                monkey_count[0] = 0;
                monkey_tail[0] = active_points[i];
                int current = 0;

                while(monkey_count[0] < max_parents){
                    if (monkey_count[current] < max_parents){
                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || used[branch]){
                            monkey_count[current]++;
                        }else{
                            const int *func = work.getIndex(branch);
                            double basis_value = RuleLocal::evalRaw<effrule>(order, func[0], node[0]);
                            for(int j=1; j<num_dimensions; j++) basis_value *= RuleLocal::evalRaw<effrule>(order, func[j], node[j]);

                            if (mode == 0) {
                                weights[branch] -= weights[active_points[i]] * basis_value;
                            } else {
                                for (int d=0; d<num_dimensions; d++)
                                    weights[branch * num_dimensions + d] -=
                                            weights[active_points[i] * num_dimensions + d] * basis_value;
                            }
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }
    }
}